

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_divu_16_pi(void)

{
  ulong uVar1;
  uint uVar2;
  uint addr_in;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = m68ki_cpu.ir;
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in + 2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar3 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  if (uVar3 != 0) {
    uVar5 = uVar2 >> 9 & 7;
    uVar1 = (ulong)m68ki_cpu.dar[uVar5] / (ulong)uVar3;
    uVar4 = (uint)uVar1;
    if (uVar4 < 0x10000) {
      m68ki_cpu.n_flag = (uint)(uVar1 >> 8);
      m68ki_cpu.v_flag = 0;
      m68ki_cpu.c_flag = 0;
      m68ki_cpu.not_z_flag = uVar4;
      m68ki_cpu.dar[uVar5] = m68ki_cpu.dar[uVar5] % uVar3 << 0x10 | uVar4;
    }
    else {
      m68ki_cpu.v_flag = 0x80;
    }
    return;
  }
  m68ki_exception_trap(5);
  return;
}

Assistant:

static void m68k_op_divu_16_pi(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AY_PI_16();

	if(src != 0)
	{
		uint quotient = *r_dst / src;
		uint remainder = *r_dst % src;

		if(quotient < 0x10000)
		{
			FLAG_Z = quotient;
			FLAG_N = NFLAG_16(quotient);
			FLAG_V = VFLAG_CLEAR;
			FLAG_C = CFLAG_CLEAR;
			*r_dst = MASK_OUT_ABOVE_32(MASK_OUT_ABOVE_16(quotient) | (remainder << 16));
			return;
		}
		FLAG_V = VFLAG_SET;
		return;
	}
	m68ki_exception_trap(EXCEPTION_ZERO_DIVIDE);
}